

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cpp
# Opt level: O1

ComponentPtr
libcellml::flattenComponent(ComponentEntityPtr *parent,ComponentPtr *component,size_t index)

{
  Units *pUVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  element_type *peVar3;
  ImportedEntityImpl *pIVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  _Base_ptr this;
  __weak_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  Model *this_00;
  bool bVar7;
  int iVar8;
  size_t sVar9;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var10;
  long *plVar11;
  undefined8 uVar12;
  _Rb_tree_node_base *p_Var13;
  iterator iVar14;
  size_t in_RCX;
  IndexStack *destinationStack;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  ModelPtr *model_00;
  void *__child_stack;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  size_t value;
  ulong uVar16;
  __weak_count<(__gnu_cxx::_Lock_policy)2> units1;
  libcellml *this_01;
  ulong uVar17;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var18;
  undefined8 uVar19;
  element_type *in_R8;
  ComponentPtr *in_R9;
  element_type *peVar20;
  pointer __x;
  UnitsPtr *units;
  long lVar21;
  element_type *peVar22;
  ComponentPtr CVar23;
  ModelPtr MVar24;
  VariablePtr localModelVariable;
  string newName;
  StringStringMap unitNamesToReplace;
  ComponentPtr importedComponentCopy;
  ModelPtr flatModel;
  ComponentNameMap newComponentNames;
  ModelPtr clonedImportModel;
  vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
  uniqueRequiredUnits;
  UnitsPtr foundUnits;
  StringStringMap aliasedUnitsNames;
  ComponentPtr importedComponent;
  EquivalenceMap map;
  IndexStack importedComponentBaseIndexStack;
  ModelPtr importModel;
  ModelPtr requiredUnitsModel;
  IndexStack destinationComponentBaseIndexStack;
  NameList compNames;
  ImportSourcePtr importSource;
  ModelPtr model;
  vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
  requiredUnits;
  EquivalenceMap rebasedMap;
  _Base_ptr local_2e0;
  undefined1 local_2d8 [32];
  undefined1 local_2b8 [40];
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_290;
  undefined1 local_280 [8];
  undefined1 local_278 [8];
  string local_270;
  undefined1 local_250 [24];
  undefined1 local_238 [32];
  undefined1 local_218 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_208 [2];
  undefined1 local_1e8 [24];
  __weak_count<(__gnu_cxx::_Lock_policy)2> _Stack_1d0;
  undefined8 local_1c8;
  element_type *local_1c0;
  string local_1b8;
  undefined1 local_198 [8];
  undefined1 local_190 [8];
  string local_188;
  ComponentEntity local_168;
  size_t local_158;
  ComponentPtr *local_150;
  undefined1 local_148 [8];
  undefined1 local_140 [24];
  _Base_ptr local_128;
  size_t local_120;
  IndexStack local_118;
  undefined1 local_100 [32];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_e0;
  Model *local_d8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_d0;
  IndexStack local_c8;
  NameList local_b0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_90;
  ParentedEntityConstPtr local_88;
  vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
  local_78;
  _Rb_tree<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::pair<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::_Select1st<std::pair<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_std::less<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>
  local_60;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var15;
  
  bVar7 = ImportedEntity::isImport((ImportedEntity *)(*(long *)index + 0x10));
  if (bVar7) {
    local_148 = *(undefined1 (*) [8])index;
    local_140._0_8_ = *(long *)(index + 8);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_140._0_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_140._0_8_)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_140._0_8_)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_140._0_8_)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_140._0_8_)->_M_use_count + 1;
      }
    }
    owningModel(&local_88);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_140._0_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_140._0_8_);
    }
    ImportedEntity::importSource((ImportedEntity *)(*(long *)index + 0x10));
    local_150 = component;
    ImportSource::model((ImportSource *)local_100);
    uVar12 = local_100._0_8_;
    ImportedEntity::importReference_abi_cxx11_
              ((string *)local_148,(ImportedEntity *)(*(long *)index + 0x10));
    iVar8 = 1;
    CVar23 = ComponentEntity::component(&local_168,(string *)uVar12,SUB81(local_148,0));
    _Var15 = CVar23.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount
             ._M_pi;
    if (local_148 != (undefined1  [8])(local_140 + 8)) {
      operator_delete((void *)local_148,local_140._8_8_ + 1);
      _Var15._M_pi = extraout_RDX;
    }
    Model::clone((Model *)local_1e8,(__fn *)local_100._0_8_,_Var15._M_pi,iVar8,in_R8);
    componentNames_abi_cxx11_(&local_b0,(libcellml *)&local_88,model_00);
    indexStackOf(&local_c8,(ComponentPtr *)index);
    indexStackOf(&local_118,(ComponentPtr *)&local_168);
    local_140._16_8_ = local_140;
    local_140._0_8_ = local_140._0_8_ & 0xffffffff00000000;
    local_140._8_8_ = 0;
    local_120 = 0;
    local_128 = (_Base_ptr)local_140._16_8_;
    recordVariableEquivalences((ComponentPtr *)&local_168,(EquivalenceMap *)local_148,&local_118);
    generateEquivalenceMap((ComponentPtr *)&local_168,(EquivalenceMap *)local_148,&local_118);
    destinationStack = &local_c8;
    rebaseEquivalenceMap
              ((EquivalenceMap *)&local_60,(EquivalenceMap *)local_148,&local_118,destinationStack);
    Component::clone((Component *)local_250,
                     (__fn *)local_168.super_NamedEntity.super_ParentedEntity.super_Entity.
                             _vptr_Entity,__child_stack,(int)destinationStack,in_R8);
    uVar12 = local_250._0_8_;
    NamedEntity::name_abi_cxx11_((string *)local_198,*(NamedEntity **)index);
    NamedEntity::setName((NamedEntity *)uVar12,(string *)local_198);
    if (local_198 != (undefined1  [8])&local_188) {
      operator_delete((void *)local_198,(long)local_188._M_dataplus._M_p + 1);
    }
    for (uVar16 = 0; sVar9 = ComponentEntity::componentCount(*(ComponentEntity **)index),
        uVar12 = local_250._0_8_, uVar16 < sVar9; uVar16 = uVar16 + 1) {
      ComponentEntity::component((ComponentEntity *)local_198,*(size_t *)index);
      ComponentEntity::addComponent((ComponentEntity *)uVar12,(ComponentPtr *)local_198);
      if (local_190 != (undefined1  [8])0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_190);
      }
    }
    local_198 = (undefined1  [8])local_250._0_8_;
    local_190 = (undefined1  [8])local_250._8_8_;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_250._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(_Atomic_word *)(local_250._8_8_ + 8) = *(_Atomic_word *)(local_250._8_8_ + 8) + 1;
        UNLOCK();
      }
      else {
        *(_Atomic_word *)(local_250._8_8_ + 8) = *(_Atomic_word *)(local_250._8_8_ + 8) + 1;
      }
    }
    unitsUsed(&local_78,(ModelPtr *)local_1e8,(ComponentConstPtr *)local_198);
    local_250._16_8_ = index;
    local_158 = in_RCX;
    if (local_190 != (undefined1  [8])0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_190);
    }
    local_1c8 = 0;
    local_1e8._16_8_ = (element_type *)0x0;
    _Stack_1d0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var13 = (_Rb_tree_node_base *)local_190;
    local_190 = (undefined1  [8])((ulong)local_190 & 0xffffffff00000000);
    local_188._M_dataplus._M_p = (pointer)0x0;
    local_188.field_2._8_8_ = 0;
    local_1c0 = (element_type *)
                local_78.
                super__Vector_base<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    local_188._M_string_length = (size_type)p_Var13;
    local_188.field_2._M_allocated_capacity = (size_type)p_Var13;
    local_100._16_8_ = parent;
    if (local_78.
        super__Vector_base<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_78.
        super__Vector_base<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      __x = local_78.
            super__Vector_base<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
      do {
        _Var6._M_pi = _Stack_1d0._M_pi;
        peVar20 = (element_type *)local_1e8._16_8_;
        paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(__x->super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        this = (_Base_ptr)
               (__x->super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
               _M_pi;
        if (this != (_Base_ptr)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(int *)&this->_M_parent = *(int *)&this->_M_parent + 1;
            UNLOCK();
          }
          else {
            *(int *)&this->_M_parent = *(int *)&this->_M_parent + 1;
          }
          if (this != (_Base_ptr)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(int *)&this->_M_parent = *(int *)&this->_M_parent + 1;
              UNLOCK();
            }
            else {
              *(int *)&this->_M_parent = *(int *)&this->_M_parent + 1;
            }
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(int *)&this->_M_parent = *(int *)&this->_M_parent + 1;
              UNLOCK();
            }
            else {
              *(int *)&this->_M_parent = *(int *)&this->_M_parent + 1;
            }
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(int *)&this->_M_parent = *(int *)&this->_M_parent + 1;
              UNLOCK();
            }
            else {
              *(int *)&this->_M_parent = *(int *)&this->_M_parent + 1;
            }
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this);
            if (this != (_Base_ptr)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                *(int *)&this->_M_parent = *(int *)&this->_M_parent + 1;
                UNLOCK();
              }
              else {
                *(int *)&this->_M_parent = *(int *)&this->_M_parent + 1;
              }
            }
          }
        }
        lVar21 = (long)_Var6._M_pi - (long)peVar20 >> 6;
        local_218._0_8_ = paVar5;
        local_218._8_8_ = this;
        if (0 < lVar21) {
          lVar21 = lVar21 + 1;
          do {
            bVar7 = Units::equivalent((UnitsPtr *)peVar20,(UnitsPtr *)local_218);
            units1._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar20;
            if (bVar7) goto LAB_0022f91d;
            bVar7 = Units::equivalent((UnitsPtr *)
                                      &peVar20->super_enable_shared_from_this<libcellml::Model>,
                                      (UnitsPtr *)local_218);
            units1._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           &peVar20->super_enable_shared_from_this<libcellml::Model>;
            if (bVar7) goto LAB_0022f91d;
            bVar7 = Units::equivalent((UnitsPtr *)(peVar20 + 1),(UnitsPtr *)local_218);
            units1._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(peVar20 + 1);
            if (bVar7) goto LAB_0022f91d;
            bVar7 = Units::equivalent((UnitsPtr *)
                                      &peVar20[1].super_enable_shared_from_this<libcellml::Model>,
                                      (UnitsPtr *)local_218);
            units1._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           &peVar20[1].super_enable_shared_from_this<libcellml::Model>;
            if (bVar7) goto LAB_0022f91d;
            peVar20 = peVar20 + 2;
            lVar21 = lVar21 + -1;
          } while (1 < lVar21);
        }
        lVar21 = (long)_Var6._M_pi - (long)peVar20 >> 4;
        if (lVar21 == 1) {
LAB_0022f907:
          bVar7 = Units::equivalent((UnitsPtr *)peVar20,(UnitsPtr *)local_218);
          units1._M_pi = _Var6._M_pi;
          if (bVar7) {
            units1._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar20;
          }
        }
        else {
          units1._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar20;
          if (lVar21 == 2) {
LAB_0022f8d3:
            bVar7 = Units::equivalent((UnitsPtr *)units1._M_pi,(UnitsPtr *)local_218);
            if (!bVar7) {
              peVar20 = (element_type *)
                        &((element_type *)units1._M_pi)->
                         super_enable_shared_from_this<libcellml::Model>;
              goto LAB_0022f907;
            }
          }
          else {
            units1._M_pi = _Var6._M_pi;
            if ((lVar21 == 3) &&
               (bVar7 = Units::equivalent((UnitsPtr *)peVar20,(UnitsPtr *)local_218),
               units1._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar20, !bVar7)) {
              units1._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                             &peVar20->super_enable_shared_from_this<libcellml::Model>;
              goto LAB_0022f8d3;
            }
          }
        }
LAB_0022f91d:
        if ((_Base_ptr)local_218._8_8_ != (_Base_ptr)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_218._8_8_);
        }
        if (this != (_Base_ptr)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this);
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this);
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this);
        }
        if (units1._M_pi == _Stack_1d0._M_pi) {
          std::
          vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
          ::push_back((vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
                       *)(local_1e8 + 0x10),__x);
        }
        else {
          NamedEntity::name_abi_cxx11_
                    ((string *)local_218,
                     &((__shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2> *)
                      &((element_type *)units1._M_pi)->super_ComponentEntity)->_M_ptr->
                      super_NamedEntity);
          NamedEntity::name_abi_cxx11_
                    ((string *)local_280,
                     &((__x->super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>).
                      _M_ptr)->super_NamedEntity);
          bVar7 = true;
          if ((undefined1  [8])local_218._8_8_ == local_278) {
            if ((_Base_ptr)local_218._8_8_ == (_Base_ptr)0x0) {
              bVar7 = false;
            }
            else {
              iVar8 = bcmp((void *)local_218._0_8_,(void *)local_280,local_218._8_8_);
              bVar7 = iVar8 != 0;
            }
          }
          if (local_280 != (undefined1  [8])&local_270) {
            operator_delete((void *)local_280,(long)local_270._M_dataplus._M_p + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_218._0_8_ != local_208) {
            operator_delete((void *)local_218._0_8_,local_208[0]._M_allocated_capacity + 1);
          }
          if (bVar7) {
            NamedEntity::name_abi_cxx11_
                      ((string *)local_218,
                       &((__x->super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>).
                        _M_ptr)->super_NamedEntity);
            NamedEntity::name_abi_cxx11_
                      ((string *)local_280,
                       &((__shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2> *)
                        &((element_type *)units1._M_pi)->super_ComponentEntity)->_M_ptr->
                        super_NamedEntity);
            std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
            ::_M_emplace_unique<std::__cxx11::string,std::__cxx11::string>
                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                        *)local_198,(string *)local_218,(string *)local_280);
            if (local_280 != (undefined1  [8])&local_270) {
              operator_delete((void *)local_280,(long)local_270._M_dataplus._M_p + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_218._0_8_ != local_208) {
              operator_delete((void *)local_218._0_8_,local_208[0]._M_allocated_capacity + 1);
            }
          }
        }
        __x = __x + 1;
      } while ((element_type *)__x != local_1c0);
    }
    MVar24 = Model::create();
    _Var6._M_pi = _Stack_1d0._M_pi;
    _Var15 = MVar24.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1e8._16_8_ != _Stack_1d0._M_pi) {
      peVar20 = (element_type *)local_1e8._16_8_;
      do {
        this_00 = local_d8;
        Units::clone((Units *)local_218,
                     (__fn *)((__shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2> *)
                             &peVar20->super_ComponentEntity)->_M_ptr,_Var15._M_pi,(int)p_Var13,
                     in_R8);
        Model::addUnits(this_00,(UnitsPtr *)local_218);
        _Var15._M_pi = extraout_RDX_00;
        if ((_Base_ptr)local_218._8_8_ != (_Base_ptr)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_218._8_8_);
          _Var15._M_pi = extraout_RDX_01;
        }
        peVar20 = (element_type *)&peVar20->super_enable_shared_from_this<libcellml::Model>;
      } while (peVar20 != (element_type *)_Var6._M_pi);
    }
    createComponentNamesMap_abi_cxx11_
              ((ComponentNameMap *)local_218,(libcellml *)local_250,(ComponentPtr *)_Var15._M_pi);
    if ((_Rb_tree_node_base *)local_208[0]._8_8_ != (_Rb_tree_node_base *)(local_218 + 8)) {
      pIVar4 = (ImportedEntityImpl *)(local_238 + 0x10);
      uVar12 = local_208[0]._8_8_;
      do {
        local_280 = (undefined1  [8])&local_270;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_280,*(long *)(uVar12 + 0x20),
                   (long)&((_Rb_tree_node_base *)(uVar12 + 0x20))->_M_parent->_M_color +
                   *(long *)(uVar12 + 0x20));
        local_2b8._0_8_ = local_2b8 + 0x10;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_2b8,local_280,
                   (pointer)((long)local_280 + (long)(_Rb_tree_color *)local_278));
        this_01 = (libcellml *)0x1;
        while (_Var10 = std::
                        __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                                  (local_b0.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start,
                                   local_b0.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish,(string *)local_2b8),
              _Var10._M_current !=
              local_b0.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
          local_238._0_8_ = pIVar4;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_238,local_280,
                     (pointer)((long)local_280 + (long)(_Rb_tree_color *)local_278));
          std::__cxx11::string::append((char *)local_238);
          convertToString_abi_cxx11_(&local_1b8,this_01,value);
          p_Var18 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xf;
          if ((ImportedEntityImpl *)local_238._0_8_ != pIVar4) {
            p_Var18 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_238._16_8_;
          }
          p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   ((long)&((__shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2> *)
                           local_238._8_8_)->_M_ptr +
                   (long)(_func_int ***)local_1b8._M_string_length);
          in_R8 = (element_type *)local_238._8_8_;
          if (p_Var18 < p_Var2) {
            uVar19 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
              uVar19 = local_1b8.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar19 < p_Var2) goto LAB_0022fc28;
            plVar11 = (long *)std::__cxx11::string::replace
                                        ((ulong)&local_1b8,0,(char *)0x0,local_238._0_8_);
          }
          else {
LAB_0022fc28:
            plVar11 = (long *)std::__cxx11::string::_M_append
                                        ((char *)local_238,(ulong)local_1b8._M_dataplus._M_p);
          }
          pUVar1 = (Units *)(plVar11 + 2);
          if ((Units *)*plVar11 == pUVar1) {
            local_2d8._16_8_ =
                 (pUVar1->super_NamedEntity).super_ParentedEntity.super_Entity._vptr_Entity;
            local_2d8._24_8_ = plVar11[3];
            local_2d8._0_8_ = (Units *)(local_2d8 + 0x10);
          }
          else {
            local_2d8._16_8_ =
                 (pUVar1->super_NamedEntity).super_ParentedEntity.super_Entity._vptr_Entity;
            local_2d8._0_8_ = (Units *)*plVar11;
          }
          local_2d8._8_8_ = plVar11[1];
          *plVar11 = (long)pUVar1;
          plVar11[1] = 0;
          *(undefined1 *)&(pUVar1->super_NamedEntity).super_ParentedEntity.super_Entity._vptr_Entity
               = 0;
          std::__cxx11::string::operator=((string *)local_2b8,(string *)local_2d8);
          if ((Units *)local_2d8._0_8_ != (Units *)(local_2d8 + 0x10)) {
            operator_delete((void *)local_2d8._0_8_,(ulong)(local_2d8._16_8_ + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
            operator_delete(local_1b8._M_dataplus._M_p,
                            (ulong)(local_1b8.field_2._M_allocated_capacity + 1));
          }
          if ((ImportedEntityImpl *)local_238._0_8_ != pIVar4) {
            operator_delete((void *)local_238._0_8_,
                            (ulong)((long)(_func_int ***)local_238._16_8_ + 1));
          }
          this_01 = this_01 + 1;
        }
        if ((local_278 != (undefined1  [8])local_2b8._8_8_) ||
           ((local_278 != (undefined1  [8])0x0 &&
            (iVar8 = bcmp((void *)local_280,(void *)local_2b8._0_8_,(size_t)local_278), iVar8 != 0))
           )) {
          NamedEntity::setName(*(NamedEntity **)(uVar12 + 0x40),(string *)local_2b8);
        }
        if ((element_type *)local_2b8._0_8_ != (element_type *)(local_2b8 + 0x10)) {
          operator_delete((void *)local_2b8._0_8_,local_2b8._16_8_ + 1);
        }
        if (local_280 != (undefined1  [8])&local_270) {
          operator_delete((void *)local_280,(long)local_270._M_dataplus._M_p + 1);
        }
        uVar12 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar12);
      } while ((_Rb_tree_node_base *)uVar12 != (_Rb_tree_node_base *)(local_218 + 8));
    }
    for (uVar16 = 0; uVar12 = local_250._16_8_,
        sVar9 = Component::variableCount
                          ((Component *)
                           ((__shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2> *)
                           local_250._16_8_)->_M_ptr), uVar16 < sVar9; uVar16 = uVar16 + 1) {
      Component::variable((Component *)local_2b8,
                          (size_t)((__shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2> *)
                                  uVar12)->_M_ptr);
      for (uVar17 = 0; sVar9 = Variable::equivalentVariableCount((Variable *)local_2b8._0_8_),
          uVar17 < sVar9; uVar17 = uVar17 + 1) {
        Variable::equivalentVariable((Variable *)local_2d8,local_2b8._0_8_);
        uVar12 = local_250._0_8_;
        NamedEntity::name_abi_cxx11_((string *)local_280,(NamedEntity *)local_2b8._0_8_);
        Component::variable((Component *)local_238,(string *)uVar12);
        if (local_280 != (undefined1  [8])&local_270) {
          operator_delete((void *)local_280,(long)local_270._M_dataplus._M_p + 1);
        }
        Variable::addEquivalence((VariablePtr *)local_238,(VariablePtr *)local_2d8);
        if ((element_type *)local_238._8_8_ != (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_238._8_8_);
        }
        if ((_Base_ptr)local_2d8._8_8_ != (_Base_ptr)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2d8._8_8_);
        }
      }
      if ((_Base_ptr)local_2b8._8_8_ != (_Base_ptr)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2b8._8_8_);
      }
    }
    ComponentEntity::replaceComponent
              (&((local_150->super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>).
                _M_ptr)->super_ComponentEntity,local_158,(ComponentPtr *)local_250);
    local_280 = (undefined1  [8])local_250._0_8_;
    local_278 = (undefined1  [8])local_250._8_8_;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_250._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(_Atomic_word *)(local_250._8_8_ + 8) = *(_Atomic_word *)(local_250._8_8_ + 8) + 1;
        UNLOCK();
      }
      else {
        *(_Atomic_word *)(local_250._8_8_ + 8) = *(_Atomic_word *)(local_250._8_8_ + 8) + 1;
      }
    }
    owningModel((ParentedEntityConstPtr *)local_238);
    if (local_278 != (undefined1  [8])0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278);
    }
    applyEquivalenceMapToModel((EquivalenceMap *)&local_60,(ModelPtr *)local_238);
    local_278 = (undefined1  [8])((ulong)local_278 & 0xffffffff00000000);
    local_270._M_dataplus._M_p = (pointer)0x0;
    local_270.field_2._8_8_ = 0;
    local_1c0 = (element_type *)_Stack_1d0._M_pi;
    local_270._M_string_length = (size_type)local_278;
    local_270.field_2._M_allocated_capacity = (size_type)(_Rb_tree_node_base *)local_278;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1e8._16_8_ != _Stack_1d0._M_pi) {
      peVar3 = (element_type *)(local_2b8 + 0x10);
      peVar20 = (element_type *)local_1e8._16_8_;
      do {
        bVar7 = ImportedEntity::isImport
                          (&((__shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2> *)
                            &peVar20->super_ComponentEntity)->_M_ptr->super_ImportedEntity);
        uVar12 = local_1e8._0_8_;
        if (bVar7) {
          NamedEntity::name_abi_cxx11_
                    ((string *)local_2b8,
                     &((__shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2> *)
                      &peVar20->super_ComponentEntity)->_M_ptr->super_NamedEntity);
          Model::units((Model *)&local_1b8,(string *)uVar12);
          if ((element_type *)local_2b8._0_8_ != peVar3) {
            operator_delete((void *)local_2b8._0_8_,local_2b8._16_8_ + 1);
          }
          units = (UnitsPtr *)0x0;
          local_2e0 = (_Base_ptr)0x0;
          peVar22 = (element_type *)0x0;
          local_250._16_8_ = peVar20;
          do {
            NamedEntity::name_abi_cxx11_
                      ((string *)local_2b8,(NamedEntity *)local_1b8._M_dataplus._M_p);
            Model::units((Model *)(local_100 + 0x18),local_1e8._0_8_);
            NamedEntity::name_abi_cxx11_((string *)local_2d8,(NamedEntity *)local_100._24_8_);
            if (local_2b8._8_8_ == local_2d8._8_8_) {
              if ((_Base_ptr)local_2b8._8_8_ == (_Base_ptr)0x0) {
                bVar7 = true;
              }
              else {
                iVar8 = bcmp((void *)local_2b8._0_8_,(void *)local_2d8._0_8_,local_2b8._8_8_);
                bVar7 = iVar8 == 0;
              }
            }
            else {
              bVar7 = false;
            }
            if ((Units *)local_2d8._0_8_ != (Units *)(local_2d8 + 0x10)) {
              operator_delete((void *)local_2d8._0_8_,(ulong)(local_2d8._16_8_ + 1));
            }
            if (local_e0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_e0);
            }
            if ((element_type *)local_2b8._0_8_ != peVar3) {
              operator_delete((void *)local_2b8._0_8_,local_2b8._16_8_ + 1);
            }
            if (bVar7) {
              flattenUnitsImports((libcellml *)local_1e8,(ModelPtr *)local_250._16_8_,units,
                                  (size_t)local_250,(ComponentPtr *)in_R8);
              Model::units((Model *)local_2b8,local_1e8._0_8_);
              uVar12 = local_2b8._8_8_;
              peVar22 = (element_type *)local_2b8._0_8_;
              local_2b8._0_8_ = (element_type *)0x0;
              local_2b8._8_8_ = (_Base_ptr)0x0;
              if (local_2e0 != (_Base_ptr)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2e0);
              }
              if ((_Base_ptr)local_2b8._8_8_ != (_Base_ptr)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2b8._8_8_);
              }
              local_2e0 = (_Base_ptr)uVar12;
            }
            peVar20 = (element_type *)local_250._16_8_;
            units = (UnitsPtr *)
                    ((long)&(units->super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>
                            )._M_ptr + 1);
          } while (peVar22 == (element_type *)0x0);
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._M_string_length !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._M_string_length);
          }
        }
        else {
          peVar22 = (element_type *)0x0;
          local_2e0 = (_Base_ptr)0x0;
        }
        local_2d8._8_8_ = local_2e0;
        local_2d8._0_8_ = peVar22;
        if (peVar22 == (element_type *)0x0) {
          local_2d8._8_8_ =
               (_Base_ptr)
               (((__shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2> *)
                &peVar20->super_ComponentEntity)->_M_refcount)._M_pi;
          local_2d8._0_8_ =
               ((__shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2> *)
               &peVar20->super_ComponentEntity)->_M_ptr;
        }
        if ((_Base_ptr)local_2d8._8_8_ != (_Base_ptr)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(int *)&((_Base_ptr)local_2d8._8_8_)->_M_parent =
                 *(int *)&((_Base_ptr)local_2d8._8_8_)->_M_parent + 1;
            UNLOCK();
          }
          else {
            *(int *)&((_Base_ptr)local_2d8._8_8_)->_M_parent =
                 *(int *)&((_Base_ptr)local_2d8._8_8_)->_M_parent + 1;
          }
        }
        for (uVar16 = 0; sVar9 = Units::unitCount((Units *)local_2d8._0_8_), uVar16 < sVar9;
            uVar16 = uVar16 + 1) {
          Units::unitAttributeReference_abi_cxx11_
                    ((string *)local_2b8,(Units *)local_2d8._0_8_,uVar16);
          for (p_Var13 = (_Rb_tree_node_base *)local_270._M_string_length;
              p_Var13 != (_Rb_tree_node_base *)local_278;
              p_Var13 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var13)) {
            if (((_Base_ptr)local_2b8._8_8_ == p_Var13[1]._M_parent) &&
               (((_Base_ptr)local_2b8._8_8_ == (_Base_ptr)0x0 ||
                (iVar8 = bcmp((void *)local_2b8._0_8_,*(void **)(p_Var13 + 1),local_2b8._8_8_),
                iVar8 == 0)))) {
              Units::setUnitAttributeReference
                        ((Units *)local_2d8._0_8_,uVar16,(string *)(p_Var13 + 2));
            }
          }
          if ((element_type *)local_2b8._0_8_ != peVar3) {
            operator_delete((void *)local_2b8._0_8_,local_2b8._16_8_ + 1);
          }
        }
        in_R8 = (element_type *)local_250;
        transferUnitsRenamingIfRequired_abi_cxx11_
                  ((StringStringMap *)local_2b8,(libcellml *)local_1e8,(ModelPtr *)local_238,
                   (ModelPtr *)local_2d8,(UnitsPtr *)in_R8,in_R9);
        if (local_290._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          ::_M_merge_unique<std::less<std::__cxx11::string>>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                      *)local_280,
                     (_Compatible_tree<std::less<std::__cxx11::basic_string<char>_>_> *)local_2b8);
        }
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)local_2b8);
        if ((_Base_ptr)local_2d8._8_8_ != (_Base_ptr)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2d8._8_8_);
        }
        if (local_2e0 != (_Base_ptr)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2e0);
        }
        peVar20 = (element_type *)&peVar20->super_enable_shared_from_this<libcellml::Model>;
      } while (peVar20 != local_1c0);
    }
    if ((_Rb_tree_node_base *)local_188._M_string_length != (_Rb_tree_node_base *)local_190) {
      p_Var13 = (_Rb_tree_node_base *)local_188._M_string_length;
      do {
        local_2b8._0_8_ = (element_type *)(local_2b8 + 0x10);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_2b8,*(long *)(p_Var13 + 2),
                   (long)&(p_Var13[2]._M_parent)->_M_color + *(long *)(p_Var13 + 2));
        iVar14 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)local_280,(key_type *)local_2b8);
        if (iVar14._M_node != (_Rb_tree_node_base *)local_278) {
          std::__cxx11::string::_M_assign((string *)local_2b8);
        }
        Model::units((Model *)local_2d8,(string *)local_238._0_8_);
        updateUnitsNameUsages
                  ((string *)(p_Var13 + 1),(key_type *)local_2b8,(ComponentPtr *)local_250,
                   (UnitsPtr *)local_2d8);
        if ((_Base_ptr)local_2d8._8_8_ != (_Base_ptr)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2d8._8_8_);
        }
        if ((element_type *)local_2b8._0_8_ != (element_type *)(local_2b8 + 0x10)) {
          operator_delete((void *)local_2b8._0_8_,local_2b8._16_8_ + 1);
        }
        p_Var13 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var13);
      } while (p_Var13 != (_Rb_tree_node_base *)local_190);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)local_280);
    if ((element_type *)local_238._8_8_ != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_238._8_8_);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<libcellml::Component>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<libcellml::Component>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<libcellml::Component>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<libcellml::Component>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<libcellml::Component>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<libcellml::Component>_>_>_>
                 *)local_218);
    parent = (ComponentEntityPtr *)local_100._16_8_;
    component = local_150;
    if (local_d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_d0);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)local_198);
    std::
    vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>::
    ~vector((vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
             *)(local_1e8 + 0x10));
    std::
    vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>::
    ~vector(&local_78);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_250._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_250._8_8_);
    }
    std::
    _Rb_tree<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::pair<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::_Select1st<std::pair<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_std::less<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>
    ::~_Rb_tree(&local_60);
    std::
    _Rb_tree<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::pair<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::_Select1st<std::pair<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_std::less<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::pair<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::_Select1st<std::pair<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_std::less<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>
                 *)local_148);
    if (local_118.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_118.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_118.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_118.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_c8.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_c8.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_b0);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1e8._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1e8._8_8_);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_168.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_168.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_100._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_100._8_8_);
    }
    if (local_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_90);
    }
    if (local_88.super___shared_ptr<const_libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_88.
                 super___shared_ptr<const_libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
  }
  CVar23 = ComponentEntity::component
                     ((ComponentEntity *)parent,
                      (size_t)(component->
                              super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>).
                              _M_ptr);
  CVar23.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)parent;
  return (ComponentPtr)CVar23.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ComponentPtr flattenComponent(const ComponentEntityPtr &parent, ComponentPtr &component, size_t index)
{
    if (component->isImport()) {
        auto model = owningModel(component);
        auto importSource = component->importSource();
        auto importModel = importSource->model();
        auto importedComponent = importModel->component(component->importReference());
        // Clone import model to not affect origin import model units.
        auto clonedImportModel = importModel->clone();

        NameList compNames = componentNames(model);

        // Determine the stack for the destination component.
        IndexStack destinationComponentBaseIndexStack = indexStackOf(component);

        // Determine the stack for the source component.
        IndexStack importedComponentBaseIndexStack = indexStackOf(importedComponent);

        // Generate equivalence map for the source component.
        EquivalenceMap map;
        recordVariableEquivalences(importedComponent, map, importedComponentBaseIndexStack);
        generateEquivalenceMap(importedComponent, map, importedComponentBaseIndexStack);

        // Rebase the generated equivalence map from the source component to the destination component.
        auto rebasedMap = rebaseEquivalenceMap(map, importedComponentBaseIndexStack, destinationComponentBaseIndexStack);

        // Take a copy of the imported component which will be used to replace the import defined in this model.
        auto importedComponentCopy = importedComponent->clone();
        importedComponentCopy->setName(component->name());
        for (size_t i = 0; i < component->componentCount(); ++i) {
            importedComponentCopy->addComponent(component->component(i));
        }

        // Get list of required units from component's variables and math cn elements.
        std::vector<UnitsPtr> requiredUnits = unitsUsed(clonedImportModel, importedComponentCopy);

        std::vector<UnitsPtr> uniqueRequiredUnits;
        StringStringMap aliasedUnitsNames;
        for (const auto &units : requiredUnits) {
            const auto iterator = std::find_if(uniqueRequiredUnits.begin(), uniqueRequiredUnits.end(),
                                               [=](const UnitsPtr &u) -> bool { return Units::equivalent(u, units); });
            if (iterator == uniqueRequiredUnits.end()) {
                uniqueRequiredUnits.push_back(units);
            } else if ((*iterator)->name() != units->name()) {
                aliasedUnitsNames.emplace(units->name(), (*iterator)->name());
            }
        }

        // Add all required units to a model so referenced units can be resolved.
        auto requiredUnitsModel = Model::create();
        for (const auto &units : uniqueRequiredUnits) {
            // Cloning units present elsewhere so that they don't get moved by the addUnits function.
            requiredUnitsModel->addUnits(units->clone());
        }

        // Make a map of component name to component pointer.
        ComponentNameMap newComponentNames = createComponentNamesMap(importedComponentCopy);
        for (const auto &entry : newComponentNames) {
            std::string originalName = entry.first;
            size_t count = 0;
            std::string newName = originalName;
            while (std::find(compNames.begin(), compNames.end(), newName) != compNames.end()) {
                newName = originalName + "_" + convertToString(++count);
            }
            if (originalName != newName) {
                entry.second->setName(newName);
            }
        }

        // If the component 'component' has variables then they are equivalent variables and they
        // need to be exchanged with the real variables from the component 'importedComponent'.
        for (size_t i = 0; i < component->variableCount(); ++i) {
            auto placeholderVariable = component->variable(i);
            for (size_t j = 0; j < placeholderVariable->equivalentVariableCount(); ++j) {
                auto localModelVariable = placeholderVariable->equivalentVariable(j);
                auto importedComponentVariable = importedComponentCopy->variable(placeholderVariable->name());
                Variable::addEquivalence(importedComponentVariable, localModelVariable);
            }
        }
        parent->replaceComponent(index, importedComponentCopy);
        auto flatModel = owningModel(importedComponentCopy);

        // Apply the re-based equivalence map onto the modified model.
        applyEquivalenceMapToModel(rebasedMap, flatModel);

        StringStringMap unitNamesToReplace;
        for (const auto &units : uniqueRequiredUnits) {
            // If the required units are imported units, we will resolve those units here.
            size_t unitsIndex = 0;
            UnitsPtr flattenedUnits = nullptr;
            if (units->isImport()) {
                auto foundUnits = clonedImportModel->units(units->name());
                while (flattenedUnits == nullptr) {
                    if (foundUnits->name() == clonedImportModel->units(unitsIndex)->name()) {
                        flattenUnitsImports(clonedImportModel, units, unitsIndex, importedComponentCopy);
                        flattenedUnits = clonedImportModel->units(unitsIndex);
                    }
                    unitsIndex += 1;
                }
            }

            auto replacementUnits = (flattenedUnits != nullptr) ? flattenedUnits : units;

            for (size_t unitIndex = 0; unitIndex < replacementUnits->unitCount(); ++unitIndex) {
                const std::string ref = replacementUnits->unitAttributeReference(unitIndex);
                for (const auto &entry : unitNamesToReplace) {
                    if (ref == entry.first) {
                        replacementUnits->setUnitAttributeReference(unitIndex, entry.second);
                    }
                }
            }
            StringStringMap changedNames = transferUnitsRenamingIfRequired(clonedImportModel, flatModel, replacementUnits, importedComponentCopy);
            if (!changedNames.empty()) {
                unitNamesToReplace.merge(changedNames);
            }
        }

        for (const auto &alias : aliasedUnitsNames) {
            std::string finalUnitsName = alias.second;
            const auto match = unitNamesToReplace.find(finalUnitsName);
            if (match != unitNamesToReplace.end()) {
                finalUnitsName = match->second;
            }
            UnitsPtr targetUnits = flatModel->units(finalUnitsName);
            updateUnitsNameUsages(alias.first, finalUnitsName, importedComponentCopy, targetUnits);
        }
    }

    return parent->component(index);
}